

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int attrset_set_attr(BigAttrSet *attrset,char *attrname,void *data,char *dtype,int nmemb)

{
  int iVar1;
  char *pcVar2;
  BigAttr *pBVar3;
  BigAttr *attr;
  int nmemb_local;
  char *dtype_local;
  void *data_local;
  char *attrname_local;
  BigAttrSet *attrset_local;
  
  attrset->dirty = 1;
  pcVar2 = strchr(attrname,0x20);
  if (((pcVar2 == (char *)0x0) && (pcVar2 = strchr(attrname,9), pcVar2 == (char *)0x0)) &&
     (pcVar2 = strchr(attrname,10), pcVar2 == (char *)0x0)) {
    pBVar3 = attrset_lookup_attr(attrset,attrname);
    if (pBVar3 != (BigAttr *)0x0) {
      attrset_remove_attr(attrset,attrname);
    }
    iVar1 = attrset_add_attr(attrset,attrname,dtype,nmemb);
    if (iVar1 == 0) {
      pBVar3 = attrset_lookup_attr(attrset,attrname);
      if (pBVar3->nmemb == nmemb) {
        iVar1 = dtype_convert_simple(pBVar3->data,pBVar3->dtype,data,dtype,(long)pBVar3->nmemb);
        return iVar1;
      }
      _big_file_raise("attr nmemb mismatch",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x6d1);
    }
    else {
      _big_file_raise("Failed to add attr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x6cd);
    }
  }
  else {
    _big_file_raise("Attribute name cannot contain blanks (space, tab or newline)",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x6c4);
  }
  return -1;
}

Assistant:

static int
attrset_set_attr(BigAttrSet * attrset, const char * attrname, const void * data, const char * dtype, int nmemb)
{
    BigAttr * attr;
    attrset->dirty = 1;

    RAISEIF (
         strchr(attrname, ' ')
      || strchr(attrname, '\t')
      || strchr(attrname, '\n'),
      ex_name,
      "Attribute name cannot contain blanks (space, tab or newline)"
    );

    /* Remove it if it exists*/
    attr = attrset_lookup_attr(attrset, attrname);
    if(attr)
        attrset_remove_attr(attrset, attrname);
    /* add ensures the dtype has been normalized! */
    RAISEIF(0 != attrset_add_attr(attrset, attrname, dtype, nmemb),
            ex_add,
            "Failed to add attr");
    attr = attrset_lookup_attr(attrset, attrname);
    RAISEIF(attr->nmemb != nmemb,
            ex_mismatch,
            "attr nmemb mismatch");
    return dtype_convert_simple(attr->data, attr->dtype, data, dtype, attr->nmemb);

ex_name:
ex_mismatch:
ex_add:
    return -1;
}